

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::perturbMin
          (SPxSolverBase<double> *this,UpdateVector<double> *uvec,VectorBase<double> *p_low,
          VectorBase<double> *p_up,double eps,double p_delta,int start,int incr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  SPxBasisBase<double> *pSVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Status SVar8;
  double *pdVar9;
  double *pdVar10;
  SSVectorBase<double> *this_00;
  IdxSet *this_01;
  char *pcVar11;
  double *pdVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  UpdateVector<double> *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  Real RVar13;
  double in_XMM1_Qa;
  int j;
  IdxSet *idx;
  double *upd;
  int i;
  double u;
  double l;
  double x;
  double maxrandom;
  double minrandom;
  double *vec;
  double in_stack_ffffffffffffff08;
  SPxBasisBase<double> *in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff18;
  Random *in_stack_ffffffffffffff20;
  SPxId *in_stack_ffffffffffffff28;
  SPxBasisBase<double> *in_stack_ffffffffffffff30;
  uint local_84;
  int local_6c;
  
  pdVar9 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x282ec3);
  if ((*(byte *)(in_RDI + 0x460) & 1) == 0) {
    UpdateVector<double>::delta(in_RSI);
    pdVar10 = SSVectorBase<double>::values((SSVectorBase<double> *)0x283243);
    this_00 = UpdateVector<double>::delta(in_RSI);
    this_01 = SSVectorBase<double>::indices(this_00);
    UpdateVector<double>::delta(in_RSI);
    iVar6 = SSVectorBase<double>::size((SSVectorBase<double> *)0x28327a);
    local_84 = (iVar6 - in_R8D) - 1;
    iVar6 = extraout_EDX;
    for (; -1 < (int)local_84; local_84 = local_84 - in_R9D) {
      pcVar11 = IdxSet::index(this_01,(char *)(ulong)local_84,iVar6);
      iVar7 = (int)pcVar11;
      dVar1 = pdVar10[iVar7];
      pdVar12 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)in_stack_ffffffffffffff10,
                           (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      pSVar4 = (SPxBasisBase<double> *)*pdVar12;
      pdVar12 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)in_stack_ffffffffffffff10,
                           (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      dVar2 = *pdVar12;
      SPxBasisBase<double>::baseId
                (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      SVar8 = SPxBasisBase<double>::dualStatus(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      iVar6 = extraout_EDX_00;
      if (SVar8 != D_ON_BOTH) {
        if (-in_XMM0_Qa <= dVar1) {
          if (in_XMM0_Qa < dVar1) {
            in_stack_ffffffffffffff18 = dVar2;
            pdVar12 = (double *)infinity();
            bVar5 = GT<double,double,double>(in_stack_ffffffffffffff18,-*pdVar12,in_XMM0_Qa);
            iVar6 = extraout_EDX_04;
            if (((bVar5) &&
                (bVar5 = NE<double,double,double>
                                   ((double)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                                    1.30189459699302e-317), iVar6 = extraout_EDX_05, bVar5)) &&
               (pdVar9[iVar7] <= dVar2 + in_XMM0_Qa)) {
              in_stack_ffffffffffffff08 = pdVar9[iVar7];
              RVar13 = Random::next(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                                    (Real)in_stack_ffffffffffffff10);
              in_stack_ffffffffffffff10 =
                   (SPxBasisBase<double> *)(in_stack_ffffffffffffff08 - RVar13);
              pdVar12 = VectorBase<double>::operator[]
                                  ((VectorBase<double> *)in_stack_ffffffffffffff10,
                                   (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
              *pdVar12 = (double)in_stack_ffffffffffffff10;
              pdVar12 = VectorBase<double>::operator[]
                                  ((VectorBase<double> *)in_stack_ffffffffffffff10,
                                   (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
              *(double *)(in_RDI + 0x380) = *(double *)(in_RDI + 0x380) - (*pdVar12 - dVar2);
              iVar6 = extraout_EDX_06;
            }
          }
        }
        else {
          in_stack_ffffffffffffff30 = pSVar4;
          pdVar12 = (double *)infinity();
          bVar5 = LT<double,double,double>((double)in_stack_ffffffffffffff30,*pdVar12,in_XMM0_Qa);
          iVar6 = extraout_EDX_01;
          if (((bVar5) &&
              (bVar5 = NE<double,double,double>
                                 ((double)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                                  1.30171525116358e-317), iVar6 = extraout_EDX_02, bVar5)) &&
             ((double)pSVar4 - in_XMM0_Qa <= pdVar9[iVar7])) {
            in_stack_ffffffffffffff20 = (Random *)pdVar9[iVar7];
            RVar13 = Random::next(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                                  (Real)in_stack_ffffffffffffff10);
            in_stack_ffffffffffffff28 = (SPxId *)((double)in_stack_ffffffffffffff20 + RVar13);
            pdVar12 = VectorBase<double>::operator[]
                                ((VectorBase<double> *)in_stack_ffffffffffffff10,
                                 (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
            *pdVar12 = (double)in_stack_ffffffffffffff28;
            pdVar12 = VectorBase<double>::operator[]
                                ((VectorBase<double> *)in_stack_ffffffffffffff10,
                                 (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
            *(double *)(in_RDI + 0x380) = (*pdVar12 - (double)pSVar4) + *(double *)(in_RDI + 0x380);
            iVar6 = extraout_EDX_03;
          }
        }
      }
    }
  }
  else {
    iVar6 = VectorBase<double>::dim((VectorBase<double> *)0x282f33);
    for (local_6c = (iVar6 - in_R8D) + -1; -1 < local_6c; local_6c = local_6c - in_R9D) {
      pdVar10 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)in_stack_ffffffffffffff10,
                           (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      dVar1 = *pdVar10;
      pdVar10 = VectorBase<double>::operator[]
                          ((VectorBase<double> *)in_stack_ffffffffffffff10,
                           (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      dVar2 = *pdVar10;
      dVar3 = pdVar9[local_6c];
      pdVar10 = (double *)infinity();
      bVar5 = LT<double,double,double>(dVar1,*pdVar10,in_XMM1_Qa);
      if (((bVar5) &&
          (bVar5 = NE<double,double,double>
                             ((double)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                              1.3012379837497e-317), bVar5)) && (dVar1 <= dVar3 + in_XMM1_Qa)) {
        RVar13 = Random::next(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                              (Real)in_stack_ffffffffffffff10);
        pdVar10 = VectorBase<double>::operator[]
                            ((VectorBase<double> *)in_stack_ffffffffffffff10,
                             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        *pdVar10 = dVar3 + RVar13;
        pdVar10 = VectorBase<double>::operator[]
                            ((VectorBase<double> *)in_stack_ffffffffffffff10,
                             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        *(double *)(in_RDI + 0x380) = (*pdVar10 - dVar1) + *(double *)(in_RDI + 0x380);
      }
      pdVar10 = (double *)infinity();
      bVar5 = GT<double,double,double>(dVar2,-*pdVar10,in_XMM1_Qa);
      if (((bVar5) &&
          (bVar5 = NE<double,double,double>
                             ((double)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                              1.30139114409991e-317), bVar5)) && (dVar3 - in_XMM1_Qa <= dVar2)) {
        RVar13 = Random::next(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                              (Real)in_stack_ffffffffffffff10);
        pdVar10 = VectorBase<double>::operator[]
                            ((VectorBase<double> *)in_stack_ffffffffffffff10,
                             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        *pdVar10 = dVar3 - RVar13;
        pdVar10 = VectorBase<double>::operator[]
                            ((VectorBase<double> *)in_stack_ffffffffffffff10,
                             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        *(double *)(in_RDI + 0x380) = *(double *)(in_RDI + 0x380) - (*pdVar10 - dVar2);
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMin(
   const UpdateVector<R>& uvec,
   VectorBase<R>& p_low,
   VectorBase<R>& p_up,
   R eps,
   R p_delta,
   int start,
   int incr)
{
   assert(uvec.dim() == p_low.dim());
   assert(uvec.dim() == p_up.dim());

   const R* vec = uvec.get_const_ptr();
   R minrandom = 10.0 * p_delta;
   R maxrandom = 100.0 * p_delta;
   R x, l, u;
   int i;

   if(fullPerturbation)
   {
      eps = p_delta;

      for(i = uvec.dim() - start - 1; i >= 0; i -= incr)
      {
         u = p_up[i];
         l = p_low[i];
         x = vec[i];

         if(LT(u, R(infinity), eps) && NE(l, u, eps) && u <= x + eps)
         {
            p_up[i] = x + random.next((double) minrandom, (double)maxrandom);
            theShift += p_up[i] - u;
         }

         if(GT(l, R(-infinity), eps) && NE(l, u, eps) && l >= x - eps)
         {
            p_low[i] = x - random.next((double)minrandom, (double)maxrandom);
            theShift -= p_low[i] - l;
         }
      }
   }
   else
   {
      const R* upd = uvec.delta().values();
      const IdxSet& idx = uvec.delta().indices();

      for(int j = uvec.delta().size() - start - 1; j >= 0; j -= incr)
      {
         i = idx.index(j);
         x = upd[i];
         u = p_up[i];
         l = p_low[i];

         // do not permute these bounds! c.f. with computeFrhs2() in spxvecs.cpp
         if(this->dualStatus(this->baseId(i)) == SPxBasisBase<R>::Desc::D_ON_BOTH)
         {
            continue;
         }

         if(x < -eps)
         {
            if(LT(u, R(infinity), eps) && NE(l, u, eps) && vec[i] >= u - eps)
            {
               p_up[i] = vec[i] + random.next((double)minrandom, (double)maxrandom);
               theShift += p_up[i] - u;
            }
         }
         else if(x > eps)
         {
            if(GT(l, R(-infinity), eps) && NE(l, u, eps) && vec[i] <= l + eps)
            {
               p_low[i] = vec[i] - random.next((double)minrandom, (double)maxrandom);
               theShift -= p_low[i] - l;
            }
         }
      }
   }
}